

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateReflectionInitializationCode
          (FileGenerator *this,Printer *p)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  initializer_list<google::protobuf::io::Printer::Sub> v_00;
  initializer_list<google::protobuf::io::Printer::Sub> v_01;
  initializer_list<google::protobuf::io::Printer::Sub> v_02;
  initializer_list<google::protobuf::io::Printer::Sub> v_03;
  initializer_list<google::protobuf::io::Printer::Sub> v_04;
  initializer_list<google::protobuf::io::Printer::Sub> v_05;
  initializer_list<google::protobuf::io::Printer::Sub> v_06;
  undefined1 auVar1 [8];
  undefined1 auVar2 [8];
  bool bVar3;
  byte bVar4;
  int iVar5;
  size_type __n;
  size_type sVar6;
  size_type sVar7;
  DescriptorStringView this_00;
  reference ppDVar8;
  Options *in_R9;
  undefined1 auVar9 [16];
  string_view name;
  string_view name_00;
  string_view separator;
  Sub *local_19e8;
  Sub *local_1940;
  unsigned_long local_18d8;
  Sub *local_1850;
  Sub *local_1808;
  Sub *local_1768;
  Sub *local_1738;
  Sub *local_16c8;
  Sub *local_1668;
  basic_string_view<char,_std::char_traits<char>_> local_1640;
  undefined1 local_1629;
  FileGenerator *local_1628;
  basic_string_view<char,_std::char_traits<char>_> local_1620;
  string local_1610;
  allocator<char> local_15e9;
  string local_15e8;
  basic_string_view<char,_std::char_traits<char>_> local_15c8;
  string local_15b8;
  allocator<char> local_1591;
  string local_1590;
  Sub *local_1570;
  Sub local_1568;
  Sub local_14b0;
  iterator local_13f8;
  size_type local_13f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_13e8;
  AlphaNum local_13d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_13a0;
  AlphaNum local_1390;
  undefined1 local_1360 [40];
  char local_1338 [16];
  undefined1 local_1328 [8];
  NamespaceOpener ns;
  value_type local_12f8;
  anon_class_16_2_4df4e3d3 local_12d8;
  value_type local_12c8;
  Descriptor *local_12a0;
  Descriptor *pinned;
  iterator __end5;
  iterator __begin5;
  vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
  *__range5;
  basic_string_view<char,_std::char_traits<char>_> local_1250;
  undefined1 local_1239;
  size_type local_1238;
  allocator<char> local_1229;
  string local_1228;
  allocator<char> local_1201;
  string local_1200;
  AlphaNum local_11e0;
  basic_string_view<char,_std::char_traits<char>_> local_11b0;
  string_view local_11a0;
  AlphaNum local_1190;
  byte local_115a;
  allocator<char> local_1159;
  undefined1 local_1158 [79];
  allocator<char> local_1109;
  string local_1108;
  unsigned_long local_10e8;
  allocator<char> local_10d9;
  string local_10d8;
  char *local_10b8;
  allocator<char> local_10a9;
  string local_10a8;
  Sub *local_1088;
  Sub local_1080;
  Sub local_fc8;
  Sub local_f10;
  Sub local_e58;
  Sub local_da0;
  Sub local_ce8;
  iterator local_c30;
  size_type local_c28;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_c20;
  undefined1 local_c0b;
  undefined1 auStack_c08 [5];
  bool eager;
  undefined8 local_c00;
  undefined1 local_bf1;
  anon_class_24_3_67b76fa3_for_cb local_bf0;
  allocator<char> local_bd1;
  string local_bd0;
  allocator<char> local_ba9;
  string local_ba8;
  undefined8 local_b88;
  Sub local_b80;
  undefined1 local_ac8 [184];
  iterator local_a10;
  size_type local_a08;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_a00;
  undefined1 local_9f0 [8];
  size_t num_deps;
  CrossFileReferences refs;
  basic_string_view<char,_std::char_traits<char>_> local_998;
  undefined1 local_981;
  anon_class_24_3_7ba27a30_for_cb local_980;
  allocator<char> local_961;
  string local_960;
  allocator<char> local_939;
  string local_938;
  Sub *local_918;
  Sub local_910;
  Sub local_858;
  iterator local_7a0;
  size_type local_798;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_790;
  undefined1 local_780 [16];
  undefined1 local_770 [8];
  string desc_name;
  string file_data;
  FileDescriptorProto file_proto;
  basic_string_view<char,_std::char_traits<char>_> local_648;
  basic_string_view<char,_std::char_traits<char>_> local_630;
  undefined1 local_619;
  anon_class_16_2_fd512ddd_for_cb local_618;
  allocator<char> local_601;
  string local_600;
  Sub *local_5e0;
  Sub local_5d8;
  iterator local_520;
  size_type local_518;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_510;
  basic_string_view<char,_std::char_traits<char>_> local_4f8;
  undefined1 local_4e1;
  anon_class_24_3_c82d5fe3_for_cb local_4e0;
  allocator<char> local_4c1;
  string local_4c0;
  anon_class_24_3_1ecdd903_for_cb local_4a0;
  allocator<char> local_481;
  string local_480;
  Sub *local_460;
  Sub local_458;
  Sub local_3a0;
  iterator local_2e8;
  size_type local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_2d8;
  undefined1 local_2c8 [8];
  vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
  offsets;
  basic_string_view<char,_std::char_traits<char>_> local_2a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_290;
  undefined1 local_279;
  undefined1 local_278 [8];
  string local_270;
  undefined8 local_250;
  Sub local_248;
  iterator local_190;
  size_type local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_180;
  basic_string_view<char,_std::char_traits<char>_> local_168;
  basic_string_view<char,_std::char_traits<char>_> local_150;
  undefined1 local_139;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_138;
  allocator<char> local_119;
  string local_118;
  undefined8 local_f8;
  Sub local_f0;
  iterator local_38;
  size_type local_30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_28;
  undefined1 local_18 [8];
  Printer *p_local;
  FileGenerator *this_local;
  
  local_18 = (undefined1  [8])p;
  p_local = (Printer *)this;
  bVar3 = std::
          vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
          ::empty(&this->enum_generators_);
  auVar1 = local_18;
  if (bVar3) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_168,
               "\n      static constexpr const ::_pb::EnumDescriptor**\n          $file_level_enum_descriptors$ = nullptr;\n    "
              );
    io::Printer::SourceLocation::current();
    io::Printer::Emit((Printer *)auVar1,local_168._M_len,local_168._M_str);
  }
  else {
    local_139 = 1;
    local_f8 = &local_f0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_118,"len",&local_119);
    local_138._M_allocated_capacity =
         std::
         vector<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
         ::size(&this->enum_generators_);
    io::Printer::Sub::Sub<unsigned_long>(&local_f0,&local_118,&local_138._M_allocated_capacity);
    local_139 = 0;
    local_38 = &local_f0;
    local_30 = 1;
    v_06._M_len = 1;
    v_06._M_array = local_38;
    absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_28._M_local_buf,v_06);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_150,
               "\n      static const ::_pb::EnumDescriptor* $file_level_enum_descriptors$[$len$];\n    "
              );
    io::Printer::SourceLocation::current();
    google::protobuf::io::Printer::Emit
              (auVar1,local_28._M_allocated_capacity,local_28._8_8_,local_150._M_len,
               local_150._M_str);
    local_1668 = (Sub *)&local_38;
    do {
      local_1668 = local_1668 + -1;
      io::Printer::Sub::~Sub(local_1668);
    } while (local_1668 != &local_f0);
    std::__cxx11::string::~string((string *)&local_118);
    std::allocator<char>::~allocator(&local_119);
  }
  bVar3 = HasGenericServices(this->file_,&this->options_);
  if ((bVar3) && (iVar5 = FileDescriptor::service_count(this->file_), auVar1 = local_18, 0 < iVar5))
  {
    local_279 = 1;
    local_250 = &local_248;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_270,"len",(allocator<char> *)(local_278 + 7));
    local_278._0_4_ = FileDescriptor::service_count(this->file_);
    io::Printer::Sub::Sub<int>(&local_248,&local_270,(int *)local_278);
    local_279 = 0;
    local_190 = &local_248;
    local_188 = 1;
    v_05._M_len = 1;
    v_05._M_array = local_190;
    absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_180._M_local_buf,v_05);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&local_290,
               "\n      static const ::_pb::ServiceDescriptor*\n          $file_level_service_descriptors$[$len$];\n    "
              );
    io::Printer::SourceLocation::current();
    google::protobuf::io::Printer::Emit
              (auVar1,local_180._M_allocated_capacity,local_180._8_8_,
               local_290._M_allocated_capacity,local_290._8_8_);
    local_16c8 = (Sub *)&local_190;
    do {
      local_16c8 = local_16c8 + -1;
      io::Printer::Sub::~Sub(local_16c8);
    } while (local_16c8 != &local_248);
    std::__cxx11::string::~string((string *)&local_270);
    std::allocator<char>::~allocator((allocator<char> *)(local_278 + 7));
  }
  else {
    auVar1 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_2a8,
               "\n      static constexpr const ::_pb::ServiceDescriptor**\n          $file_level_service_descriptors$ = nullptr;\n    "
              );
    io::Printer::SourceLocation::current();
    io::Printer::Emit((Printer *)auVar1,local_2a8._M_len,local_2a8._M_str);
  }
  bVar3 = std::
          vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
          ::empty(&this->message_generators_);
  auVar1 = local_18;
  if (bVar3) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_648,
               "\n      const ::uint32_t $tablename$::offsets[1] = {};\n      static constexpr ::_pbi::MigrationSchema* schemas = nullptr;\n      static constexpr ::_pb::Message* const* file_default_instances = nullptr;\n    "
              );
    io::Printer::SourceLocation::current();
    io::Printer::Emit((Printer *)auVar1,local_648._M_len,local_648._M_str);
  }
  else {
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              *)local_2c8);
    __n = std::
          vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
          ::size(&this->message_generators_);
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::reserve((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *)local_2c8,__n);
    auVar1 = local_18;
    local_4e1 = '\x01';
    local_460 = &local_458;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_480,"offsets",&local_481);
    local_4a0.offsets =
         (vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          *)local_2c8;
    local_4a0.p = (Printer **)local_18;
    local_4a0.this = this;
    io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::FileGenerator::GenerateReflectionInitializationCode(google::protobuf::io::Printer*)::__2>
              (&local_458,&local_480,&local_4a0);
    local_460 = &local_3a0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c0,"schemas",&local_4c1);
    local_4e0.p = (Printer **)local_18;
    local_4e0.offsets =
         (vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
          *)local_2c8;
    local_4e0.this = this;
    io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::FileGenerator::GenerateReflectionInitializationCode(google::protobuf::io::Printer*)::__3>
              (&local_3a0,&local_4c0,&local_4e0);
    local_4e1 = '\0';
    local_2e8 = &local_458;
    local_2e0 = 2;
    v_04._M_len = 2;
    v_04._M_array = local_2e8;
    absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_2d8._M_local_buf,v_04);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_4f8,
               "\n          const ::uint32_t\n              $tablename$::offsets[] ABSL_ATTRIBUTE_SECTION_VARIABLE(\n                  protodesc_cold) = {\n                  $offsets$,\n          };\n\n          static const ::_pbi::MigrationSchema\n              schemas[] ABSL_ATTRIBUTE_SECTION_VARIABLE(protodesc_cold) = {\n                  $schemas$,\n          };\n        "
              );
    io::Printer::SourceLocation::current();
    google::protobuf::io::Printer::Emit
              (auVar1,local_2d8._M_allocated_capacity,local_2d8._8_8_,local_4f8._M_len,
               local_4f8._M_str);
    local_1738 = (Sub *)&local_2e8;
    do {
      local_1738 = local_1738 + -1;
      io::Printer::Sub::~Sub(local_1738);
    } while (local_1738 != &local_458);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::allocator<char>::~allocator(&local_4c1);
    std::__cxx11::string::~string((string *)&local_480);
    std::allocator<char>::~allocator(&local_481);
    bVar3 = UsingImplicitWeakDescriptor(this->file_,&this->options_);
    auVar1 = local_18;
    if (!bVar3) {
      local_619 = 1;
      local_5e0 = &local_5d8;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_600,"defaults",&local_601)
      ;
      local_618.p = (Printer **)local_18;
      local_618.this = this;
      io::Printer::Sub::
      Sub<google::protobuf::compiler::cpp::FileGenerator::GenerateReflectionInitializationCode(google::protobuf::io::Printer*)::__4>
                (&local_5d8,&local_600,&local_618);
      local_619 = 0;
      local_520 = &local_5d8;
      local_518 = 1;
      v_03._M_len = 1;
      v_03._M_array = local_520;
      absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
      Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
                ((Span<google::protobuf::io::Printer::Sub_const> *)local_510._M_local_buf,v_03);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_630,
                 "\n                static const ::_pb::Message* const file_default_instances[] = {\n                    $defaults$,\n                };\n              "
                );
      io::Printer::SourceLocation::current();
      google::protobuf::io::Printer::Emit
                (auVar1,local_510._M_allocated_capacity,local_510._8_8_,local_630._M_len,
                 local_630._M_str);
      local_1768 = (Sub *)&local_520;
      do {
        local_1768 = local_1768 + -1;
        io::Printer::Sub::~Sub(local_1768);
      } while (local_1768 != &local_5d8);
      std::__cxx11::string::~string((string *)&local_600);
      std::allocator<char>::~allocator(&local_601);
    }
    std::
    vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
    ::~vector((vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
               *)local_2c8);
  }
  StripSourceRetentionOptions((compiler *)(file_data.field_2._M_local_buf + 8),this->file_,false);
  std::__cxx11::string::string((string *)(desc_name.field_2._M_local_buf + 8));
  google::protobuf::MessageLite::SerializeToString((string *)(file_data.field_2._M_local_buf + 8));
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)local_780,
             "descriptor_table_protodef");
  name._M_str = (char *)this->file_;
  name._M_len = local_780._8_8_;
  UniqueName_abi_cxx11_
            ((string *)local_770,(cpp *)local_780._0_8_,name,(FileDescriptor *)&this->options_,in_R9
            );
  auVar1 = local_18;
  local_981 = 1;
  local_918 = &local_910;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_938,"desc_name",&local_939);
  io::Printer::Sub::Sub<std::__cxx11::string&>
            (&local_910,&local_938,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_770);
  local_918 = &local_858;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_960,"encoded_file_proto",&local_961);
  local_980.p = (Printer **)local_18;
  local_980.file_data = (string *)((long)&desc_name.field_2 + 8);
  local_980.this = this;
  io::Printer::Sub::
  Sub<google::protobuf::compiler::cpp::FileGenerator::GenerateReflectionInitializationCode(google::protobuf::io::Printer*)::__5>
            (&local_858,&local_960,&local_980);
  local_981 = 0;
  local_7a0 = &local_910;
  local_798 = 2;
  v_02._M_len = 2;
  v_02._M_array = local_7a0;
  absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_790._M_local_buf,v_02);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_998,
             "\n        const char $desc_name$[] ABSL_ATTRIBUTE_SECTION_VARIABLE(\n            protodesc_cold) = {\n            $encoded_file_proto$,\n        };\n      "
            );
  io::Printer::SourceLocation::current();
  google::protobuf::io::Printer::Emit
            (auVar1,local_790._M_allocated_capacity,local_790._8_8_,local_998._M_len,
             local_998._M_str);
  local_1808 = (Sub *)&local_7a0;
  do {
    local_1808 = local_1808 + -1;
    io::Printer::Sub::~Sub(local_1808);
  } while (local_1808 != &local_910);
  std::__cxx11::string::~string((string *)&local_960);
  std::allocator<char>::~allocator(&local_961);
  std::__cxx11::string::~string((string *)&local_938);
  std::allocator<char>::~allocator(&local_939);
  CrossFileReferences::CrossFileReferences((CrossFileReferences *)&num_deps);
  GetCrossFileReferencesForFile(this,this->file_,(CrossFileReferences *)&num_deps);
  sVar6 = absl::lts_20240722::container_internal::
          btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
          ::size((btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
                  *)&refs.weak_default_instances.
                     super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
                     .
                     super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::Descriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::Descriptor_*>,_256,_false>_>_>
                     .tree_.size_);
  sVar7 = absl::lts_20240722::container_internal::
          btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
          ::size((btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
                  *)&refs.strong_reflection_files.
                     super_btree_set_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
                     .
                     super_btree_container<absl::lts_20240722::container_internal::btree<absl::lts_20240722::container_internal::set_params<const_google::protobuf::FileDescriptor_*,_google::protobuf::compiler::cpp::FileGenerator::CrossFileReferences::DescCompare,_std::allocator<const_google::protobuf::FileDescriptor_*>,_256,_false>_>_>
                     .tree_.size_);
  auVar1 = local_18;
  local_9f0 = (undefined1  [8])(sVar6 + sVar7);
  if (local_9f0 != (undefined1  [8])0x0) {
    local_bf1 = '\x01';
    local_b88 = &local_b80;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_ba8,"len",&local_ba9);
    io::Printer::Sub::Sub<unsigned_long&>(&local_b80,&local_ba8,(unsigned_long *)local_9f0);
    local_b88 = local_ac8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_bd0,"deps",&local_bd1);
    local_bf0.refs = (CrossFileReferences *)&num_deps;
    local_bf0.p = (Printer **)local_18;
    local_bf0.this = this;
    io::Printer::Sub::
    Sub<google::protobuf::compiler::cpp::FileGenerator::GenerateReflectionInitializationCode(google::protobuf::io::Printer*)::__6>
              ((Sub *)local_ac8,&local_bd0,&local_bf0);
    local_bf1 = '\0';
    local_a10 = &local_b80;
    local_a08 = 2;
    v_01._M_len = 2;
    v_01._M_array = local_a10;
    absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_a00._M_local_buf,v_01);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_c08,
               "\n          static const ::_pbi::DescriptorTable* const $desc_table$_deps[$len$] =\n              {\n                  $deps$,\n          };\n        "
              );
    io::Printer::SourceLocation::current();
    google::protobuf::io::Printer::Emit
              (auVar1,local_a00._M_allocated_capacity,local_a00._8_8_,_auStack_c08,local_c00);
    local_1850 = (Sub *)&local_a10;
    do {
      local_1850 = local_1850 + -1;
      io::Printer::Sub::~Sub(local_1850);
    } while (local_1850 != &local_b80);
    std::__cxx11::string::~string((string *)&local_bd0);
    std::allocator<char>::~allocator(&local_bd1);
    std::__cxx11::string::~string((string *)&local_ba8);
    std::allocator<char>::~allocator(&local_ba9);
  }
  auVar1 = local_18;
  local_c0b = 0;
  local_1239 = 1;
  local_1088 = &local_1080;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_10a8,"eager",&local_10a9);
  local_10b8 = "false";
  if ((local_c0b & 1) != 0) {
    local_10b8 = "true";
  }
  io::Printer::Sub::Sub<char_const*>(&local_1080,&local_10a8,&local_10b8);
  local_1088 = &local_fc8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_10d8,"file_proto_len",&local_10d9);
  if (((this->options_).strip_nonfunctional_codegen & 1U) == 0) {
    local_18d8 = std::__cxx11::string::size();
  }
  else {
    local_18d8 = 0;
  }
  local_10e8 = local_18d8;
  io::Printer::Sub::Sub<unsigned_long>(&local_fc8,&local_10d8,&local_10e8);
  local_1088 = &local_f10;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1108,"proto_name",&local_1109)
  ;
  io::Printer::Sub::Sub<std::__cxx11::string&>
            (&local_f10,&local_1108,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_770);
  local_1088 = &local_e58;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_1158 + 0x28),"deps_ptr",(allocator<char> *)(local_1158 + 0x27));
  auVar2 = local_18;
  local_115a = 0;
  if (local_9f0 == (undefined1  [8])0x0) {
    std::allocator<char>::allocator();
    local_115a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)local_1158,"nullptr",&local_1159);
  }
  else {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_11b0,"desc_table");
    local_11a0 = (string_view)
                 google::protobuf::io::Printer::LookupVar
                           (auVar2,local_11b0._M_len,local_11b0._M_str);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_1190,local_11a0);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_11e0,"_deps");
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_1158,&local_1190);
  }
  io::Printer::Sub::Sub<std::__cxx11::string>
            (&local_e58,(string *)(local_1158 + 0x28),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1158);
  local_1088 = &local_da0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1200,"num_deps",&local_1201);
  io::Printer::Sub::Sub<unsigned_long&>(&local_da0,&local_1200,(unsigned_long *)local_9f0);
  local_1088 = &local_ce8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1228,"num_msgs",&local_1229);
  local_1238 = std::
               vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
               ::size(&this->message_generators_);
  io::Printer::Sub::Sub<unsigned_long>(&local_ce8,&local_1228,&local_1238);
  local_1239 = 0;
  local_c30 = &local_1080;
  local_c28 = 6;
  v_00._M_len = 6;
  v_00._M_array = local_c30;
  absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
  Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
            ((Span<google::protobuf::io::Printer::Sub_const> *)local_c20._M_local_buf,v_00);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_1250,
             "\n        static ::absl::once_flag $desc_table$_once;\n        PROTOBUF_CONSTINIT const ::_pbi::DescriptorTable $desc_table$ = {\n            false,\n            $eager$,\n            $file_proto_len$,\n            $proto_name$,\n            \"$filename$\",\n            &$desc_table$_once,\n            $deps_ptr$,\n            $num_deps$,\n            $num_msgs$,\n            schemas,\n            file_default_instances,\n            $tablename$::offsets,\n            $file_level_enum_descriptors$,\n            $file_level_service_descriptors$,\n        };\n      "
            );
  io::Printer::SourceLocation::current();
  google::protobuf::io::Printer::Emit
            (auVar1,local_c20._M_allocated_capacity,local_c20._8_8_,local_1250._M_len,
             local_1250._M_str);
  local_1940 = (Sub *)&local_c30;
  do {
    local_1940 = local_1940 + -1;
    io::Printer::Sub::~Sub(local_1940);
  } while (local_1940 != &local_1080);
  std::__cxx11::string::~string((string *)&local_1228);
  std::allocator<char>::~allocator(&local_1229);
  std::__cxx11::string::~string((string *)&local_1200);
  std::allocator<char>::~allocator(&local_1201);
  std::__cxx11::string::~string((string *)local_1158);
  if ((local_115a & 1) != 0) {
    std::allocator<char>::~allocator(&local_1159);
  }
  std::__cxx11::string::~string((string *)(local_1158 + 0x28));
  std::allocator<char>::~allocator((allocator<char> *)(local_1158 + 0x27));
  std::__cxx11::string::~string((string *)&local_1108);
  std::allocator<char>::~allocator(&local_1109);
  std::__cxx11::string::~string((string *)&local_10d8);
  std::allocator<char>::~allocator(&local_10d9);
  std::__cxx11::string::~string((string *)&local_10a8);
  std::allocator<char>::~allocator(&local_10a9);
  this_00 = FileDescriptor::name_abi_cxx11_(this->file_);
  auVar9 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)this_00);
  bVar4 = google::protobuf::internal::cpp::IsLazilyInitializedFile(auVar9._0_8_,auVar9._8_8_);
  if ((bVar4 & 1) == 0) {
    bVar3 = UsingImplicitWeakDescriptor(this->file_,&this->options_);
    if (bVar3) {
      GetMessagesToPinGloballyForWeakDescriptors
                ((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                  *)&__begin5,this->file_,&this->options_);
      __end5 = std::
               vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
               ::begin((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                        *)&__begin5);
      pinned = (Descriptor *)
               std::
               vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
               ::end((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                      *)&__begin5);
      while( true ) {
        bVar3 = __gnu_cxx::operator!=
                          (&__end5,(__normal_iterator<const_google::protobuf::Descriptor_**,_std::vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>_>
                                    *)&pinned);
        if (!bVar3) break;
        ppDVar8 = __gnu_cxx::
                  __normal_iterator<const_google::protobuf::Descriptor_**,_std::vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>_>
                  ::operator*(&__end5);
        local_12d8.pinned = *ppDVar8;
        local_12d8.this = this;
        local_12a0 = local_12d8.pinned;
        absl::lts_20240722::AnyInvocable<void(google::protobuf::io::Printer*)>::
        AnyInvocable<google::protobuf::compiler::cpp::FileGenerator::GenerateReflectionInitializationCode(google::protobuf::io::Printer*)::__0,void>
                  ((AnyInvocable<void(google::protobuf::io::Printer*)> *)&local_12c8,&local_12d8);
        std::
        vector<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>,_std::allocator<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>_>_>
        ::push_back(this->static_initializers_ + 1,&local_12c8);
        absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>::~AnyInvocable
                  (&local_12c8);
        __gnu_cxx::
        __normal_iterator<const_google::protobuf::Descriptor_**,_std::vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>_>
        ::operator++(&__end5);
      }
      std::
      vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
      ::~vector((vector<const_google::protobuf::Descriptor_*,_std::allocator<const_google::protobuf::Descriptor_*>_>
                 *)&__begin5);
    }
    absl::lts_20240722::AnyInvocable<void(google::protobuf::io::Printer*)>::
    AnyInvocable<google::protobuf::compiler::cpp::FileGenerator::GenerateReflectionInitializationCode(google::protobuf::io::Printer*)::__1,void>
              ((AnyInvocable<void(google::protobuf::io::Printer*)> *)&local_12f8,
               (anon_class_1_0_00000001 *)
               ((long)&ns.name_stack_.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::
    vector<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>,_std::allocator<absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>_>_>
    ::push_back(this->static_initializers_ + 1,&local_12f8);
    absl::lts_20240722::AnyInvocable<void_(google::protobuf::io::Printer_*)>::~AnyInvocable
              (&local_12f8);
  }
  bVar3 = IsFileDescriptorProto(this->file_,&this->options_);
  auVar1 = local_18;
  if (bVar3) {
    io::Printer::SourceLocation::current();
    NamespaceOpener::NamespaceOpener((NamespaceOpener *)local_1328,auVar1);
    local_13a0 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
                  )ProtobufNamespace(&this->options_);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_1390,(string_view)local_13a0);
    absl::lts_20240722::AlphaNum::AlphaNum(&local_13d0,"::internal");
    absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)local_1360,&local_1390);
    join_0x00000010_0x00000000_ =
         std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_1360);
    io::Printer::SourceLocation::current();
    NamespaceOpener::ChangeTo((NamespaceOpener *)local_1328,local_1360._32_8_,local_1338._0_8_);
    std::__cxx11::string::~string((string *)local_1360);
    auVar1 = local_18;
    local_1629 = 1;
    local_1570 = &local_1568;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1590,"dummy",&local_1591);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_15c8,"dynamic_init_dummy");
    name_00._M_str = (char *)this->file_;
    name_00._M_len = (size_t)local_15c8._M_str;
    UniqueName_abi_cxx11_
              (&local_15b8,(cpp *)local_15c8._M_len,name_00,(FileDescriptor *)&this->options_,in_R9)
    ;
    io::Printer::Sub::Sub<std::__cxx11::string>(&local_1568,&local_1590,&local_15b8);
    local_1570 = &local_14b0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_15e8,"initializers",&local_15e9);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1620,"\n");
    separator._M_str = (char *)&local_1628;
    separator._M_len = (size_t)local_1620._M_str;
    local_1628 = this;
    absl::lts_20240722::
    StrJoin<std::vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>>,std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>>>>,google::protobuf::compiler::cpp::FileGenerator::GenerateReflectionInitializationCode(google::protobuf::io::Printer*)::__7>
              (&local_1610,(lts_20240722 *)&this->message_generators_,
               (vector<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::MessageGenerator,_std::default_delete<google::protobuf::compiler::cpp::MessageGenerator>_>_>_>
                *)local_1620._M_len,separator,(anon_class_8_1_8991fb9c *)in_R9);
    io::Printer::Sub::Sub<std::__cxx11::string>(&local_14b0,&local_15e8,&local_1610);
    local_1629 = 0;
    local_13f8 = &local_1568;
    local_13f0 = 2;
    v._M_len = 2;
    v._M_array = local_13f8;
    absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_13e8._M_local_buf,v);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1640,
               "\n          //~ Emit wants an indented line, so give it a comment to strip.\n#if !defined(PROTOBUF_CONSTINIT_DEFAULT_INSTANCES)\n          PROTOBUF_EXPORT void InitializeFileDescriptorDefaultInstancesSlow() {\n            $initializers$;\n          }\n          PROTOBUF_ATTRIBUTE_INIT_PRIORITY1\n          static std::true_type $dummy${\n              (InitializeFileDescriptorDefaultInstances(), std::true_type{})};\n#endif  // !defined(PROTOBUF_CONSTINIT_DEFAULT_INSTANCES)\n        "
              );
    io::Printer::SourceLocation::current();
    google::protobuf::io::Printer::Emit
              (auVar1,local_13e8._M_allocated_capacity,local_13e8._8_8_,local_1640._M_len,
               local_1640._M_str);
    local_19e8 = (Sub *)&local_13f8;
    do {
      local_19e8 = local_19e8 + -1;
      io::Printer::Sub::~Sub(local_19e8);
    } while (local_19e8 != &local_1568);
    std::__cxx11::string::~string((string *)&local_1610);
    std::__cxx11::string::~string((string *)&local_15e8);
    std::allocator<char>::~allocator(&local_15e9);
    std::__cxx11::string::~string((string *)&local_15b8);
    std::__cxx11::string::~string((string *)&local_1590);
    std::allocator<char>::~allocator(&local_1591);
    NamespaceOpener::~NamespaceOpener((NamespaceOpener *)local_1328);
  }
  CrossFileReferences::~CrossFileReferences((CrossFileReferences *)&num_deps);
  std::__cxx11::string::~string((string *)local_770);
  std::__cxx11::string::~string((string *)(desc_name.field_2._M_local_buf + 8));
  google::protobuf::FileDescriptorProto::~FileDescriptorProto
            ((FileDescriptorProto *)(file_data.field_2._M_local_buf + 8));
  return;
}

Assistant:

void FileGenerator::GenerateReflectionInitializationCode(io::Printer* p) {
  if (!enum_generators_.empty()) {
    p->Emit({{"len", enum_generators_.size()}}, R"cc(
      static const ::_pb::EnumDescriptor* $file_level_enum_descriptors$[$len$];
    )cc");
  } else {
    p->Emit(R"cc(
      static constexpr const ::_pb::EnumDescriptor**
          $file_level_enum_descriptors$ = nullptr;
    )cc");
  }

  if (HasGenericServices(file_, options_) && file_->service_count() > 0) {
    p->Emit({{"len", file_->service_count()}}, R"cc(
      static const ::_pb::ServiceDescriptor*
          $file_level_service_descriptors$[$len$];
    )cc");
  } else {
    p->Emit(R"cc(
      static constexpr const ::_pb::ServiceDescriptor**
          $file_level_service_descriptors$ = nullptr;
    )cc");
  }

  if (!message_generators_.empty()) {
    std::vector<std::pair<size_t, size_t>> offsets;
    offsets.reserve(message_generators_.size());

    p->Emit(
        {
            {"offsets",
             [&] {
               for (size_t i = 0; i < message_generators_.size(); ++i) {
                 offsets.push_back(message_generators_[i]->GenerateOffsets(p));
               }
             }},
            {"schemas",
             [&] {
               int offset = 0;
               for (size_t i = 0; i < message_generators_.size(); ++i) {
                 message_generators_[i]->GenerateSchema(p, offset,
                                                        offsets[i].second);
                 offset += offsets[i].first;
               }
             }},
        },
        R"cc(
          const ::uint32_t
              $tablename$::offsets[] ABSL_ATTRIBUTE_SECTION_VARIABLE(
                  protodesc_cold) = {
                  $offsets$,
          };

          static const ::_pbi::MigrationSchema
              schemas[] ABSL_ATTRIBUTE_SECTION_VARIABLE(protodesc_cold) = {
                  $schemas$,
          };
        )cc");
    if (!UsingImplicitWeakDescriptor(file_, options_)) {
      p->Emit({{"defaults",
                [&] {
                  for (auto& gen : message_generators_) {
                    p->Emit(
                        {
                            {"ns", Namespace(gen->descriptor(), options_)},
                            {"class", ClassName(gen->descriptor())},
                        },
                        R"cc(
                          &$ns$::_$class$_default_instance_._instance,
                        )cc");
                  }
                }}},
              R"cc(
                static const ::_pb::Message* const file_default_instances[] = {
                    $defaults$,
                };
              )cc");
    }
  } else {
    // Ee still need these symbols to exist.
    //
    // MSVC doesn't like empty arrays, so we add a dummy.
    p->Emit(R"cc(
      const ::uint32_t $tablename$::offsets[1] = {};
      static constexpr ::_pbi::MigrationSchema* schemas = nullptr;
      static constexpr ::_pb::Message* const* file_default_instances = nullptr;
    )cc");
  }

  // ---------------------------------------------------------------

  // Embed the descriptor.  We simply serialize the entire
  // FileDescriptorProto/ and embed it as a string literal, which is parsed and
  // built into real descriptors at initialization time.

  FileDescriptorProto file_proto = StripSourceRetentionOptions(*file_);
  std::string file_data;
  file_proto.SerializeToString(&file_data);

  auto desc_name = UniqueName("descriptor_table_protodef", file_, options_);
  p->Emit(
      {{"desc_name", desc_name},
       {"encoded_file_proto",
        [&] {
          if (options_.strip_nonfunctional_codegen) {
            p->Emit(R"cc("")cc");
            return;
          }

          absl::string_view data = file_data;
          if (data.size() <= 65535) {
            static constexpr size_t kBytesPerLine = 40;
            while (!data.empty()) {
              auto to_write = std::min(kBytesPerLine, data.size());
              auto chunk = data.substr(0, to_write);
              data = data.substr(to_write);

              p->Emit({{"text", EscapeTrigraphs(absl::CEscape(chunk))}}, R"cc(
                "$text$"
              )cc");
            }
            return;
          }

          // Workaround for MSVC: "Error C1091: compiler limit: string exceeds
          // 65535 bytes in length". Declare a static array of chars rather than
          // use a string literal. Only write 25 bytes per line.
          static constexpr size_t kBytesPerLine = 25;
          while (!data.empty()) {
            auto to_write = std::min(kBytesPerLine, data.size());
            auto chunk = data.substr(0, to_write);
            data = data.substr(to_write);

            std::string line;
            for (char c : chunk) {
              absl::StrAppend(&line, "'",
                              absl::CEscape(absl::string_view(&c, 1)), "', ");
            }

            p->Emit({{"line", line}}, R"cc(
              $line$
            )cc");
          }
        }}},
      R"cc(
        const char $desc_name$[] ABSL_ATTRIBUTE_SECTION_VARIABLE(
            protodesc_cold) = {
            $encoded_file_proto$,
        };
      )cc");

  CrossFileReferences refs;
  GetCrossFileReferencesForFile(file_, &refs);
  size_t num_deps =
      refs.strong_reflection_files.size() + refs.weak_reflection_files.size();

  // Build array of DescriptorTable deps.
  if (num_deps > 0) {
    p->Emit(
        {
            {"len", num_deps},
            {"deps",
             [&] {
               for (auto dep : refs.strong_reflection_files) {
                 p->Emit({{"name", DescriptorTableName(dep, options_)}}, R"cc(
                   &::$name$,
                 )cc");
               }
               for (auto dep : refs.weak_reflection_files) {
                 p->Emit({{"name", DescriptorTableName(dep, options_)}}, R"cc(
                   &::$name$,
                 )cc");
               }
             }},
        },
        R"cc(
          static const ::_pbi::DescriptorTable* const $desc_table$_deps[$len$] =
              {
                  $deps$,
          };
        )cc");
  }

  // The DescriptorTable itself.
  // Should be "bool eager = NeedsEagerDescriptorAssignment(file_, options_);"
  // however this might cause a tsan failure in superroot b/148382879,
  // so disable for now.
  bool eager = false;
  p->Emit(
      {
          {"eager", eager ? "true" : "false"},
          {"file_proto_len",
           options_.strip_nonfunctional_codegen ? 0 : file_data.size()},
          {"proto_name", desc_name},
          {"deps_ptr", num_deps == 0
                           ? "nullptr"
                           : absl::StrCat(p->LookupVar("desc_table"), "_deps")},
          {"num_deps", num_deps},
          {"num_msgs", message_generators_.size()},
      },
      R"cc(
        static ::absl::once_flag $desc_table$_once;
        PROTOBUF_CONSTINIT const ::_pbi::DescriptorTable $desc_table$ = {
            false,
            $eager$,
            $file_proto_len$,
            $proto_name$,
            "$filename$",
            &$desc_table$_once,
            $deps_ptr$,
            $num_deps$,
            $num_msgs$,
            schemas,
            file_default_instances,
            $tablename$::offsets,
            $file_level_enum_descriptors$,
            $file_level_service_descriptors$,
        };
      )cc");

  // For descriptor.proto and cpp_features.proto we want to avoid doing any
  // dynamic initialization, because in some situations that would otherwise
  // pull in a lot of unnecessary code that can't be stripped by --gc-sections.
  // Descriptor initialization will still be performed lazily when it's needed.
  if (!IsLazilyInitializedFile(file_->name())) {
    if (UsingImplicitWeakDescriptor(file_, options_)) {
      for (auto* pinned :
           GetMessagesToPinGloballyForWeakDescriptors(file_, options_)) {
        static_initializers_[kInitPriority102].push_back([this,
                                                          pinned](auto* p) {
          p->Emit({{"pin", StrongReferenceToType(pinned, options_)}},
                  R"cc(
                    $pin$,
                  )cc");
        });
      }
    }
    static_initializers_[kInitPriority102].push_back([](auto* p) {
      p->Emit(R"cc(
        ::_pbi::AddDescriptors(&$desc_table$),
      )cc");
    });
  }

  // However, we must provide a way to force initialize the default instances
  // of FileDescriptorProto which will be used during registration of other
  // files.
  if (IsFileDescriptorProto(file_, options_)) {
    NamespaceOpener ns(p);
    ns.ChangeTo(absl::StrCat(ProtobufNamespace(options_), "::internal"));
    p->Emit(
        {{"dummy", UniqueName("dynamic_init_dummy", file_, options_)},
         {"initializers", absl::StrJoin(message_generators_, "\n",
                                        [&](std::string* out, const auto& gen) {
                                          absl::StrAppend(
                                              out,
                                              DefaultInstanceName(
                                                  gen->descriptor(), options_),
                                              ".Init();");
                                        })}},
        R"cc(
          //~ Emit wants an indented line, so give it a comment to strip.
#if !defined(PROTOBUF_CONSTINIT_DEFAULT_INSTANCES)
          PROTOBUF_EXPORT void InitializeFileDescriptorDefaultInstancesSlow() {
            $initializers$;
          }
          PROTOBUF_ATTRIBUTE_INIT_PRIORITY1
          static std::true_type $dummy${
              (InitializeFileDescriptorDefaultInstances(), std::true_type{})};
#endif  // !defined(PROTOBUF_CONSTINIT_DEFAULT_INSTANCES)
        )cc");
  }
}